

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariationalBayesEstimatorOnLDA.cpp
# Opt level: O3

void __thiscall
VariationalBayesEstimatorOnLDA::updateHyperParameters(VariationalBayesEstimatorOnLDA *this)

{
  longdouble lVar1;
  longdouble lVar2;
  longdouble lVar3;
  int iVar4;
  ulong uVar5;
  uint uVar6;
  policy<boost::math::policies::promote_float<false>,_boost::math::policies::promote_double<false>,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>
  *in_RCX;
  policy<boost::math::policies::promote_float<false>,_boost::math::policies::promote_double<false>,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>
  *pol;
  integral_constant<int,_53> *in_RDX;
  integral_constant<int,_53> *extraout_RDX;
  integral_constant<int,_53> *extraout_RDX_00;
  integral_constant<int,_53> *extraout_RDX_01;
  integral_constant<int,_53> *extraout_RDX_02;
  integral_constant<int,_53> *extraout_RDX_03;
  integral_constant<int,_53> *extraout_RDX_04;
  integral_constant<int,_53> *t;
  integral_constant<int,_53> *extraout_RDX_05;
  integral_constant<int,_53> *extraout_RDX_06;
  integral_constant<int,_53> *piVar7;
  ulong uVar8;
  long lVar9;
  longdouble in_ST0;
  longdouble lVar10;
  longdouble lVar11;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble in_ST5;
  longdouble lVar12;
  longdouble in_ST6;
  double dVar13;
  detail local_99;
  undefined1 local_98 [11];
  detail local_8d;
  longdouble local_8c;
  double local_80;
  longdouble local_74;
  double local_68;
  double local_60;
  double local_58;
  double local_50;
  double local_48;
  double local_40;
  double local_38;
  
  if (this->_D == 0) {
    local_80 = 0.0;
    uVar5 = 0;
  }
  else {
    local_80 = 0.0;
    uVar8 = 0;
    local_8c = (longdouble)1.79769313486232e+308;
    do {
      local_38 = (this->_nd).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar8] + this->_alphaSum;
      boost::math::detail::
      digamma_imp<long_double,boost::integral_constant<int,53>,boost::math::policies::policy<boost::math::policies::promote_float<false>,boost::math::policies::promote_double<false>,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy>>
                ((longdouble *)0x0,&local_99,(longdouble)local_38,in_RDX,in_RCX);
      piVar7 = extraout_RDX;
      lVar11 = in_ST5;
      if (local_8c < ABS(in_ST0)) {
        local_98._0_10_ = in_ST0;
        boost::math::policies::detail::raise_error<std::overflow_error,double>
                  ("boost::math::digamma<%1%>(%1%)","numeric overflow");
        piVar7 = extraout_RDX_00;
        in_ST0 = (longdouble)local_98._0_10_;
      }
      local_40 = (double)in_ST0;
      local_98._0_8_ = local_40;
      boost::math::detail::
      digamma_imp<long_double,boost::integral_constant<int,53>,boost::math::policies::policy<boost::math::policies::promote_float<false>,boost::math::policies::promote_double<false>,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy>>
                ((longdouble *)0x0,&local_99,(longdouble)this->_alphaSum,piVar7,in_RCX);
      in_RDX = extraout_RDX_01;
      lVar10 = in_ST1;
      in_ST0 = in_ST2;
      lVar1 = in_ST3;
      lVar2 = in_ST4;
      lVar3 = in_ST5;
      lVar12 = lVar11;
      in_ST6 = lVar11;
      if (local_8c < ABS(in_ST1)) {
        local_74 = in_ST1;
        boost::math::policies::detail::raise_error<std::overflow_error,double>
                  ("boost::math::digamma<%1%>(%1%)","numeric overflow");
        in_RDX = extraout_RDX_02;
        lVar10 = local_74;
        in_ST0 = in_ST2;
        lVar1 = in_ST3;
        lVar2 = in_ST4;
        lVar3 = in_ST5;
      }
      in_ST5 = lVar12;
      in_ST4 = lVar11;
      in_ST3 = lVar3;
      in_ST2 = lVar2;
      in_ST1 = lVar1;
      local_48 = (double)lVar10;
      local_80 = local_80 + ((double)local_98._0_8_ - local_48);
      uVar8 = uVar8 + 1;
      uVar5 = (ulong)this->_D;
    } while (uVar8 < uVar5);
  }
  uVar6 = this->_K;
  if (uVar6 != 0) {
    piVar7 = (integral_constant<int,_53> *)0x0;
    local_74 = (longdouble)1.79769313486232e+308;
    do {
      dVar13 = 0.0;
      iVar4 = (int)uVar5;
      uVar5 = 0;
      if (iVar4 != 0) {
        local_98._0_10_ = (unkuint10)(ushort)local_98._8_2_ << 0x40;
        lVar9 = 0;
        uVar8 = 0;
        lVar11 = in_ST1;
        lVar10 = in_ST3;
        do {
          in_ST3 = in_ST5;
          in_ST1 = lVar10;
          pol = *(policy<boost::math::policies::promote_float<false>,_boost::math::policies::promote_double<false>,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>
                  **)((long)&(((this->_ndk).
                               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->
                             super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                             super__Vector_impl_data._M_start + lVar9);
          local_50 = *(double *)(pol + (long)piVar7 * 8) +
                     (this->_alpha).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[(long)piVar7];
          boost::math::detail::
          digamma_imp<long_double,boost::integral_constant<int,53>,boost::math::policies::policy<boost::math::policies::promote_float<false>,boost::math::policies::promote_double<false>,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy>>
                    ((longdouble *)0x0,&local_8d,(longdouble)local_50,in_RDX,pol);
          t = extraout_RDX_03;
          lVar10 = in_ST2;
          lVar1 = in_ST4;
          in_ST5 = in_ST6;
          local_8c = in_ST0;
          if (local_74 < ABS(in_ST0)) {
            boost::math::policies::detail::raise_error<std::overflow_error,double>
                      ("boost::math::digamma<%1%>(%1%)","numeric overflow");
            t = extraout_RDX_04;
            lVar10 = in_ST2;
            lVar1 = in_ST4;
          }
          in_ST4 = in_ST6;
          in_ST2 = lVar1;
          in_ST0 = lVar10;
          local_68 = (double)local_8c;
          local_58 = local_68;
          boost::math::detail::
          digamma_imp<long_double,boost::integral_constant<int,53>,boost::math::policies::policy<boost::math::policies::promote_float<false>,boost::math::policies::promote_double<false>,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy>>
                    ((longdouble *)0x0,&local_99,
                     (longdouble)
                     (this->_alpha).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[(long)piVar7],t,pol);
          in_RDX = extraout_RDX_05;
          in_ST6 = in_ST5;
          local_8c = lVar11;
          if (local_74 < ABS(lVar11)) {
            boost::math::policies::detail::raise_error<std::overflow_error,double>
                      ("boost::math::digamma<%1%>(%1%)","numeric overflow");
            in_RDX = extraout_RDX_06;
          }
          local_60 = (double)local_8c;
          dVar13 = (double)local_98._0_8_ +
                   (local_68 - local_60) *
                   (this->_alpha).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[(long)piVar7];
          local_98._0_8_ = dVar13;
          uVar8 = uVar8 + 1;
          uVar5 = (ulong)this->_D;
          lVar9 = lVar9 + 0x18;
          lVar11 = in_ST1;
          lVar10 = in_ST3;
        } while (uVar8 < uVar5);
        uVar6 = this->_K;
      }
      (this->_alpha).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start[(long)piVar7] = dVar13 / local_80;
      piVar7 = piVar7 + 1;
      in_RDX = (integral_constant<int,_53> *)(ulong)uVar6;
    } while (piVar7 < in_RDX);
  }
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::push_back(&this->_alphaTimeSeries,&this->_alpha);
  (*this->_vptr_VariationalBayesEstimatorOnLDA[8])(this,0);
  (*this->_vptr_VariationalBayesEstimatorOnLDA[5])(this);
  return;
}

Assistant:

void VariationalBayesEstimatorOnLDA::updateHyperParameters(){//{{{
    double denominator = 0;
    for(int d=0;d<_D;d++){
        denominator += boost::math::digamma(_nd[d]+_alphaSum) - boost::math::digamma(_alphaSum);
    }
    for(int k=0;k<_K;k++){
        double numerator = 0;
        for(int d=0;d<_D;d++){
            //ndk == 0 -> alphak == 0  digamma(0) - digamma(0) = 0
            try{
                numerator += (boost::math::digamma(_ndk[d][k]+_alpha[k]) - boost::math::digamma(_alpha[k])) * _alpha[k];
            }catch(...){
                numerator += 0;
            }
        }
        _alpha[k] = numerator / denominator;
    }
    _alphaTimeSeries.push_back(_alpha);
    this->updateBeta(SYMMETRY);
    this->calculateHyperParamSum();
}